

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPool.cpp
# Opt level: O1

Ptr<DescriptorPool> __thiscall
myvk::DescriptorPool::Create
          (DescriptorPool *this,Ptr<Device> *device,uint32_t max_sets,
          vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *sizes)

{
  Ptr<DescriptorPool> PVar1;
  VkDescriptorPoolCreateInfo create_info;
  VkDescriptorPoolCreateInfo local_38;
  
  local_38.pNext = (void *)0x0;
  local_38.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  local_38._4_4_ = 0;
  local_38.maxSets = max_sets;
  local_38.flags = 1;
  local_38.pPoolSizes =
       (sizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38._24_8_ =
       (ulong)((long)(sizes->
                     super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)local_38.pPoolSizes) >> 3 &
       0xffffffff;
  PVar1 = Create(this,device,&local_38);
  PVar1.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<DescriptorPool>)
         PVar1.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<DescriptorPool> DescriptorPool::Create(const Ptr<Device> &device, uint32_t max_sets,
                                                       const std::vector<VkDescriptorPoolSize> &sizes) {
	VkDescriptorPoolCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
	create_info.flags = VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT;
	create_info.maxSets = max_sets;
	create_info.poolSizeCount = sizes.size();
	create_info.pPoolSizes = sizes.data();

	return Create(device, create_info);
}